

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O2

OPJ_BOOL opj_mct_encode_custom
                   (OPJ_BYTE *pCodingdata,OPJ_SIZE_T n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  void *pvVar1;
  OPJ_INT32 OVar2;
  OPJ_BOOL OVar3;
  void *ptr;
  OPJ_SIZE_T OVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  
  uVar7 = (ulong)pNbComp;
  ptr = opj_malloc((ulong)(pNbComp * pNbComp + pNbComp) << 2);
  if (ptr == (void *)0x0) {
    OVar3 = 0;
  }
  else {
    pvVar1 = (void *)((long)ptr + uVar7 * 4);
    for (uVar5 = 0; pNbComp * pNbComp != uVar5; uVar5 = uVar5 + 1) {
      *(int *)((long)pvVar1 + uVar5 * 4) = (int)(*(float *)(pCodingdata + uVar5 * 4) * 8192.0);
    }
    for (OVar4 = 0; OVar4 != n; OVar4 = OVar4 + 1) {
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)ptr + uVar5 * 4) = *(undefined4 *)pData[uVar5];
      }
      pvVar9 = pvVar1;
      for (uVar5 = 0; uVar5 != uVar7; uVar5 = uVar5 + 1) {
        piVar6 = (int *)pData[uVar5];
        *piVar6 = 0;
        for (lVar8 = 0; uVar7 * 4 - lVar8 != 0; lVar8 = lVar8 + 4) {
          OVar2 = opj_int_fix_mul(*(OPJ_INT32 *)((long)pvVar9 + lVar8),
                                  *(OPJ_INT32 *)((long)ptr + lVar8));
          piVar6 = (int *)pData[uVar5];
          *piVar6 = *piVar6 + OVar2;
        }
        pData[uVar5] = (OPJ_BYTE *)(piVar6 + 1);
        pvVar9 = (void *)((long)pvVar9 + lVar8);
      }
    }
    opj_free(ptr);
    OVar3 = 1;
  }
  return OVar3;
}

Assistant:

OPJ_BOOL opj_mct_encode_custom(
    OPJ_BYTE * pCodingdata,
    OPJ_SIZE_T n,
    OPJ_BYTE ** pData,
    OPJ_UINT32 pNbComp,
    OPJ_UINT32 isSigned)
{
    OPJ_FLOAT32 * lMct = (OPJ_FLOAT32 *) pCodingdata;
    OPJ_SIZE_T i;
    OPJ_UINT32 j;
    OPJ_UINT32 k;
    OPJ_UINT32 lNbMatCoeff = pNbComp * pNbComp;
    OPJ_INT32 * lCurrentData = 00;
    OPJ_INT32 * lCurrentMatrix = 00;
    OPJ_INT32 ** lData = (OPJ_INT32 **) pData;
    OPJ_UINT32 lMultiplicator = 1 << 13;
    OPJ_INT32 * lMctPtr;

    OPJ_ARG_NOT_USED(isSigned);

    lCurrentData = (OPJ_INT32 *) opj_malloc((pNbComp + lNbMatCoeff) * sizeof(
            OPJ_INT32));
    if (! lCurrentData) {
        return OPJ_FALSE;
    }

    lCurrentMatrix = lCurrentData + pNbComp;

    for (i = 0; i < lNbMatCoeff; ++i) {
        lCurrentMatrix[i] = (OPJ_INT32)(*(lMct++) * (OPJ_FLOAT32)lMultiplicator);
    }

    for (i = 0; i < n; ++i)  {
        lMctPtr = lCurrentMatrix;
        for (j = 0; j < pNbComp; ++j) {
            lCurrentData[j] = (*(lData[j]));
        }

        for (j = 0; j < pNbComp; ++j) {
            *(lData[j]) = 0;
            for (k = 0; k < pNbComp; ++k) {
                *(lData[j]) += opj_int_fix_mul(*lMctPtr, lCurrentData[k]);
                ++lMctPtr;
            }

            ++lData[j];
        }
    }

    opj_free(lCurrentData);

    return OPJ_TRUE;
}